

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* SoapySDR::listSearchPaths_abi_cxx11_(void)

{
  bool bVar1;
  int iVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  istream *__x;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string pluginPath;
  stringstream pluginPaths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *searchPaths;
  value_type *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_310 [32];
  string local_2f0 [32];
  stringstream local_2d0 [392];
  string local_148 [32];
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [32];
  string local_50 [32];
  string local_30 [39];
  byte local_9;
  
  local_9 = 0;
  __lhs = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x183739);
  getRootPath_abi_cxx11_();
  std::operator+(in_stack_fffffffffffffcb8,
                 (char *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  getABIVersion_abi_cxx11_();
  std::operator+(__lhs,in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
              in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  getRootPath_abi_cxx11_();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                          (char *)in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_c0);
  if (bVar1) {
    getABIVersion_abi_cxx11_();
    std::operator+((char *)in_stack_fffffffffffffcb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    if ((listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_), iVar2 != 0
       )) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,"",&local_101);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      __cxa_atexit(std::__cxx11::string::~string,listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_);
    }
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (pcVar4 = (char *)std::__cxx11::string::at(0x1ad8e8), *pcVar4 == '/'))
    {
      getABIVersion_abi_cxx11_();
      std::operator+((char *)in_stack_fffffffffffffcb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                  in_stack_fffffffffffffca8);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_148);
    }
  }
  getEnvImpl_abi_cxx11_((char *)__lhs);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_2d0,local_2f0,_Var3);
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::string(local_310);
  while( true ) {
    __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_2d0,local_310,':');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(__x + *(long *)(*(long *)__x + -0x18)));
    if (!bVar1) break;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(_Var3,in_stack_fffffffffffffcc0),(value_type *)__x);
    }
  }
  local_9 = 1;
  std::__cxx11::string::~string(local_310);
  std::__cxx11::stringstream::~stringstream(local_2d0);
  if ((local_9 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(_Var3,in_stack_fffffffffffffcc0));
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)__lhs;
}

Assistant:

std::vector<std::string> SoapySDR::listSearchPaths(void)
{
    //the default search path
    std::vector<std::string> searchPaths;
    searchPaths.push_back(SoapySDR::getRootPath() + "/lib/SoapySDR/modules" + SoapySDR::getABIVersion());

    //support /usr/local module installs when the install prefix is /usr
    if (SoapySDR::getRootPath() == "/usr")
    {
        searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
        //when using a multi-arch directory, support single-arch path as well
        static const std::string libsuffix("");
        if (not libsuffix.empty() and libsuffix.at(0) == '/')
            searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
    }

    //separator for search paths
    #ifdef _MSC_VER
    static const char sep = ';';
    #else
    static const char sep = ':';
    #endif

    //check the environment's search path
    std::stringstream pluginPaths(getEnvImpl("SOAPY_SDR_PLUGIN_PATH"));
    std::string pluginPath;
    while (std::getline(pluginPaths, pluginPath, sep))
    {
        if (pluginPath.empty()) continue;
        searchPaths.push_back(pluginPath);
    }

    return searchPaths;
}